

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  long *plVar1;
  size_type sVar2;
  long lVar3;
  cmListFileFunction *pcVar4;
  void *pvVar5;
  char cVar6;
  ulong uVar7;
  ostream *poVar8;
  cmCommandContext *in_RCX;
  ulong uVar9;
  _Map_pointer ppbVar10;
  ulong uVar11;
  void *__src;
  long lVar12;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  undefined1 local_1a8 [376];
  
  sVar2 = fb[8].StartingContext.FilePath.field_2._M_allocated_capacity;
  if (fb[8].StartingContext.FilePath._M_string_length == sVar2) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ulong *)(sVar2 - 8);
  }
  sVar2 = fb[8].StartingContext.Name.field_2._M_allocated_capacity;
  lVar3 = *(long *)((long)&fb[8].StartingContext.Name.field_2 + 8);
  uVar11 = (long)(lVar3 - sVar2) >> 3;
  ppbVar10 = (_Map_pointer)0x0;
  lVar12 = 0;
  uVar9 = uVar11;
  do {
    if (uVar9 <= uVar7) goto LAB_0028a98e;
    uVar9 = uVar9 - 1;
    pcVar4 = *(cmListFileFunction **)(lVar3 + -8 + lVar12);
    lVar12 = lVar12 + -8;
  } while (pcVar4 != lff);
  cVar6 = (**(code **)((pcVar4->super_cmCommandContext).Name._M_dataplus._M_p + 8))();
  if (cVar6 == '\0') {
    cmListFileContext::FromCommandContext(&local_1f0,in_RCX,(string *)&lff->Arguments);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar8 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)&(lff->super_cmCommandContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
    poVar8 = operator<<(poVar8,&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.FilePath._M_dataplus._M_p != &local_1f0.FilePath.field_2) {
      operator_delete(local_1f0.FilePath._M_dataplus._M_p,
                      local_1f0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.Name._M_dataplus._M_p != &local_1f0.Name.field_2) {
      operator_delete(local_1f0.Name._M_dataplus._M_p,
                      local_1f0.Name.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = sVar2 + uVar11 * 8;
  ppbVar10 = *(_Map_pointer *)(lVar3 + lVar12);
  __src = (void *)(lVar3 + lVar12 + 8);
  pvVar5 = *(void **)((long)&fb[8].StartingContext.Name.field_2 + 8);
  if (__src != pvVar5) {
    memmove((void *)(lVar3 + lVar12),__src,(long)pvVar5 + (-lVar12 - lVar3) + -8);
  }
  plVar1 = (long *)((long)&fb[8].StartingContext.Name.field_2 + 8);
  *plVar1 = *plVar1 + -8;
LAB_0028a98e:
  (this->FindPackageModuleStack).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = ppbVar10;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

CM_AUTO_PTR<cmFunctionBlocker> cmMakefile::RemoveFunctionBlocker(
  cmFunctionBlocker* fb, const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if (!this->FunctionBlockerBarriers.empty()) {
    barrier = this->FunctionBlockerBarriers.back();
  }

  // Search for the function blocker whose scope this command ends.
  for (FunctionBlockersType::size_type i = this->FunctionBlockers.size();
       i > barrier; --i) {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb) {
      // Warn if the arguments do not match, but always remove.
      if (!(*pos)->ShouldRemove(lff, *this)) {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
          cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        /* clang-format off */
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        /* clang-format on */
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
      }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return CM_AUTO_PTR<cmFunctionBlocker>(b);
    }
  }

  return CM_AUTO_PTR<cmFunctionBlocker>();
}